

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix-ops.cpp
# Opt level: O3

Mat * pobr::imgProcessing::utils::matrixOps::forEachPixel
                (Mat *img,function<void_(const_unsigned_long_&,_const_unsigned_long_&)> *operation)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  unsigned_long local_30;
  unsigned_long local_28;
  
  local_28 = 0;
  iVar1 = *(int *)(img + 0xc);
  if (iVar1 != 0) {
    uVar3 = (ulong)*(uint *)(img + 8);
    do {
      local_30 = 0;
      iVar2 = (int)uVar3;
      uVar3 = 0;
      if (iVar2 != 0) {
        do {
          if ((operation->super__Function_base)._M_manager == (_Manager_type)0x0) {
            std::__throw_bad_function_call();
          }
          (*operation->_M_invoker)((_Any_data *)operation,&local_28,&local_30);
          local_30 = local_30 + 1;
          uVar3 = (ulong)*(int *)(img + 8);
        } while (local_30 < uVar3);
        iVar1 = *(int *)(img + 0xc);
      }
      local_28 = local_28 + 1;
    } while (local_28 < (ulong)(long)iVar1);
  }
  return img;
}

Assistant:

const cv::Mat&
matrixOps::forEachPixel(
    const cv::Mat& img,
    const std::function<void(const uint64_t& x, const uint64_t& y)>& operation
)
{
    for (uint64_t x = 0; x < img.cols; x++) {
        for (uint64_t y = 0; y < img.rows; y++) {
            operation(x, y);
        }
    }

    return img;
}